

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *descriptor;
  bool bVar1;
  CppType CVar2;
  Syntax SVar3;
  Type TVar4;
  EnumDescriptor *pEVar5;
  FileDescriptor *pFVar6;
  string *psVar7;
  string *psVar8;
  Descriptor *pDVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar9 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    psVar7 = Descriptor::full_name_abi_cxx11_(pDVar9);
    bVar1 = anon_unknown_1::AllowedExtendeeInProto3(psVar7);
    if (!bVar1) {
      psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar7,&local_20->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  bVar1 = FieldDescriptor::is_required((FieldDescriptor *)proto_local);
  if (bVar1) {
    psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar7,&local_20->super_Message,TYPE,"Required fields are not allowed in proto3.")
    ;
  }
  bVar1 = FieldDescriptor::has_default_value((FieldDescriptor *)proto_local);
  if (bVar1) {
    psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar7,&local_20->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
  if ((CVar2 == CPPTYPE_ENUM) &&
     (pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local),
     pEVar5 != (EnumDescriptor *)0x0)) {
    pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
    pFVar6 = EnumDescriptor::file(pEVar5);
    SVar3 = FileDescriptor::syntax(pFVar6);
    if (SVar3 != SYNTAX_PROTO3) {
      pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
      pFVar6 = EnumDescriptor::file(pEVar5);
      SVar3 = FileDescriptor::syntax(pFVar6);
      if (SVar3 != SYNTAX_UNKNOWN) {
        psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
        descriptor = local_20;
        pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
        psVar8 = EnumDescriptor::full_name_abi_cxx11_(pEVar5);
        std::operator+(&local_a0,"Enum type \"",psVar8);
        std::operator+(&local_80,&local_a0,"\" is not a proto3 enum, but is used in \"");
        pDVar9 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
        psVar8 = Descriptor::full_name_abi_cxx11_(pDVar9);
        std::operator+(&local_60,&local_80,psVar8);
        std::operator+(&local_40,&local_60,"\" which is a proto3 message type.");
        AddError(this,psVar7,&descriptor->super_Message,TYPE,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  TVar4 = FieldDescriptor::type((FieldDescriptor *)proto_local);
  if (TVar4 == TYPE_GROUP) {
    psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar7,&local_20->super_Message,TYPE,"Groups are not supported in proto3 syntax.")
    ;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3 &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_UNKNOWN) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}